

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# getcold.c
# Opt level: O0

int ffggpd(fitsfile *fptr,long group,long firstelem,long nelem,double *array,int *status)

{
  int *in_R9;
  char cdummy;
  int idummy;
  long row;
  double in_stack_00007258;
  long in_stack_00007260;
  LONGLONG in_stack_00007268;
  LONGLONG in_stack_00007270;
  LONGLONG in_stack_00007278;
  int in_stack_00007284;
  fitsfile *in_stack_00007288;
  int in_stack_000072d0;
  double *in_stack_000072d8;
  char *in_stack_000072e0;
  int *in_stack_000072e8;
  int *in_stack_000072f0;
  
  ffgcld(in_stack_00007288,in_stack_00007284,in_stack_00007278,in_stack_00007270,in_stack_00007268,
         in_stack_00007260,in_stack_000072d0,in_stack_00007258,in_stack_000072d8,in_stack_000072e0,
         in_stack_000072e8,in_stack_000072f0);
  return *in_R9;
}

Assistant:

int ffggpd( fitsfile *fptr,   /* I - FITS file pointer                       */
            long  group,      /* I - group to read (1 = 1st group)           */
            long  firstelem,  /* I - first vector element to read (1 = 1st)  */
            long  nelem,      /* I - number of values to read                */
            double *array,    /* O - array of values that are returned       */
            int  *status)     /* IO - error status                           */
/*
  Read an array of group parameters from the primary array. Data conversion
  and scaling will be performed if necessary (e.g, if the datatype of
  the FITS array is not the same as the array being read).
*/
{
    long row;
    int idummy;
    char cdummy;
    /*
      the primary array is represented as a binary table:
      each group of the primary array is a row in the table,
      where the first column contains the group parameters
      and the second column contains the image itself.
    */

    row=maxvalue(1,group);

    ffgcld(fptr, 1, row, firstelem, nelem, 1, 1, 0.,
               array, &cdummy, &idummy, status);
    return(*status);
}